

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O1

void __thiscall
FIX::Message::Message(Message *this,string *string,DataDictionary *dataDictionary,bool validate)

{
  long *plVar1;
  void *pvVar2;
  atomic<long> *counter;
  message_order local_50;
  
  local_50.m_mode = normal;
  local_50.m_delim = 0;
  local_50.m_groupOrder.m_size._0_4_ = 0;
  local_50.m_groupOrder.m_size._4_4_ = 0;
  local_50.m_groupOrder.m_buffer._0_4_ = 0;
  local_50.m_groupOrder.m_buffer._4_4_ = 0;
  local_50.m_largest = 0;
  FieldMap::FieldMap(&this->super_FieldMap,&local_50);
  plVar1 = (long *)CONCAT44(local_50.m_groupOrder.m_buffer._4_4_,
                            local_50.m_groupOrder.m_buffer._0_4_);
  if (plVar1 != (long *)0x0) {
    LOCK();
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    if (*plVar1 == 0) {
      pvVar2 = (void *)CONCAT44(local_50.m_groupOrder.m_buffer._4_4_,
                                local_50.m_groupOrder.m_buffer._0_4_);
      local_50.m_groupOrder.m_size._0_4_ = 0;
      local_50.m_groupOrder.m_size._4_4_ = 0;
      local_50.m_groupOrder.m_buffer._0_4_ = 0;
      local_50.m_groupOrder.m_buffer._4_4_ = 0;
      if (pvVar2 != (void *)0x0) {
        operator_delete__(pvVar2);
      }
    }
  }
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_001f92d0;
  Header::Header(&this->m_header);
  Trailer::Trailer(&this->m_trailer);
  this->m_validStructure = true;
  this->m_tag = 0;
  setString(this,string,validate,dataDictionary,dataDictionary);
  return;
}

Assistant:

EXCEPT(InvalidMessage)
    : m_validStructure(true),
      m_tag(0) {
  setString(string, validate, &dataDictionary, &dataDictionary);
}